

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_binsri_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t u5)

{
  int32_t sh_d;
  int iVar1;
  long lVar2;
  fpr_t *pfVar3;
  ulong uVar4;
  fpr_t *pfVar5;
  uint uVar6;
  byte bVar7;
  ushort uVar8;
  ulong uVar9;
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x11f2,
                  "void helper_msa_binsri_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar5 = (env->active_fpu).fpr + ws;
  switch(df) {
  case 0:
    iVar1 = (u5 & 7) + 1;
    lVar2 = 0;
    do {
      bVar7 = *(byte *)((long)pfVar5 + lVar2);
      if (iVar1 != 8) {
        bVar7 = bVar7 & (byte)(0xff >> ((byte)(u5 & 7) ^ 7)) |
                *(byte *)((long)pfVar3 + lVar2) & (byte)(-1 << (sbyte)iVar1);
      }
      *(byte *)((long)pfVar3 + lVar2) = bVar7;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    break;
  case 1:
    bVar7 = (byte)(u5 & 0xf);
    lVar2 = 0;
    do {
      uVar8 = *(ushort *)((long)pfVar5 + lVar2 * 2);
      if ((u5 & 0xf) != 0xf) {
        uVar8 = *(ushort *)((long)pfVar3 + lVar2 * 2) & (ushort)(-2 << bVar7) |
                uVar8 & (ushort)(0xffff >> (bVar7 ^ 0xf));
      }
      *(ushort *)((long)pfVar3 + lVar2 * 2) = uVar8;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    break;
  case 2:
    iVar1 = (u5 & 0x1f) + 1;
    lVar2 = 0;
    do {
      uVar6 = pfVar5->fs[lVar2];
      if (iVar1 != 0x20) {
        uVar6 = uVar6 & (uint)(0xffffffffL >> ((byte)(u5 & 0x1f) ^ 0x1f)) |
                pfVar3->fs[lVar2] & (uint)(-1L << (sbyte)iVar1);
      }
      pfVar3->fs[lVar2] = uVar6;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 3:
    iVar1 = (u5 & 0x3f) + 1;
    if (iVar1 == 0x40) {
      pfVar3->fd = pfVar5->fd;
      uVar4 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    }
    else {
      uVar4 = 0xffffffffffffffff >> (~(byte)(u5 & 0x3f) & 0x3f);
      uVar9 = -1L << ((byte)iVar1 & 0x3f);
      pfVar3->fd = pfVar5->fd & uVar4 | pfVar3->fd & uVar9;
      uVar4 = uVar4 & *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8) |
              uVar9 & *(ulong *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
    }
    *(ulong *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = uVar4;
    return;
  }
  return;
}

Assistant:

static inline int64_t msa_subs_s_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    int64_t max_int = DF_MAX_INT(df);
    int64_t min_int = DF_MIN_INT(df);
    if (arg2 > 0) {
        return (min_int + arg2 < arg1) ? arg1 - arg2 : min_int;
    } else {
        return (arg1 < max_int + arg2) ? arg1 - arg2 : max_int;
    }
}